

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O3

FxExpression * ParseExpressionG(FScanner *sc,PClassActor *cls)

{
  int o;
  bool bVar1;
  FxExpression *this;
  FxExpression *r;
  int token;
  FxExpression *l;
  
  this = ParseExpressionF(sc,cls);
  bVar1 = FScanner::GetToken(sc);
  l = this;
  if (bVar1) {
    do {
      o = sc->TokenType;
      this = l;
      if (1 < o - 0x11fU) break;
      r = ParseExpressionF(sc,cls);
      this = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x40);
      FxCompareEq::FxCompareEq((FxCompareEq *)this,o,l,r);
      bVar1 = FScanner::GetToken(sc);
      l = this;
    } while (bVar1);
  }
  if (sc->End == false) {
    FScanner::UnGet(sc);
  }
  return this;
}

Assistant:

static FxExpression *ParseExpressionG (FScanner &sc, PClassActor *cls)
{
	FxExpression *tmp = ParseExpressionF (sc, cls);

	while (sc.GetToken() && (sc.TokenType == TK_Eq || sc.TokenType == TK_Neq))
	{
		int token = sc.TokenType;
		FxExpression *right = ParseExpressionF (sc, cls);
		tmp = new FxCompareEq(token, tmp, right);
	}
	if (!sc.End) sc.UnGet();
	return tmp;
}